

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad_uint<unsigned_int>(uint n,uint width,memory_buf_t *dest)

{
  uint uVar1;
  uint in_ESI;
  char *unaff_retaddr;
  char *zeroes;
  undefined4 in_stack_00000010;
  uint digits;
  
  uVar1 = count_digits<unsigned_int>(0);
  if (uVar1 < in_ESI) {
    fmt::v6::internal::buffer<char>::append<char>
              ((buffer<char> *)CONCAT44(digits,in_stack_00000010),zeroes,unaff_retaddr);
  }
  append_int<unsigned_int>(digits,(memory_buf_t *)zeroes);
  return;
}

Assistant:

inline void pad_uint(T n, unsigned int width, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad_uint must get unsigned T");
    auto digits = count_digits(n);
    if (width > digits)
    {
        const char *zeroes = "0000000000000000000";
        dest.append(zeroes, zeroes + width - digits);
    }
    append_int(n, dest);
}